

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TracerTest.cpp
# Opt level: O0

void __thiscall
jaegertracing::Tracer_testTracerTags_Test::TestBody(Tracer_testTracerTags_Test *this)

{
  bool bVar1;
  element_type *peVar2;
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *pvVar3;
  char *pcVar4;
  string *rhs;
  AssertHelper local_710 [8];
  Message local_708 [15];
  allocator local_6f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f8;
  undefined1 local_6d8 [8];
  AssertionResult gtest_ar;
  AssertHelper local_6a8 [8];
  Message local_6a0 [8];
  __normal_iterator<const_jaegertracing::Tag_*,_std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>_>
  local_698;
  allocator local_689;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_688;
  allocator local_661;
  string local_660;
  Tag local_640;
  __normal_iterator<const_jaegertracing::Tag_*,_std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>_>
  local_5f8;
  __normal_iterator<const_jaegertracing::Tag_*,_std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>_>
  local_5f0;
  __normal_iterator<const_jaegertracing::Tag_*,_std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>_>
  local_5e8;
  bool local_5d9;
  undefined1 local_5d8 [8];
  AssertionResult gtest_ar__1;
  AssertionResult local_5c0 [2];
  AssertHelper local_5a0 [8];
  Message local_598 [8];
  __normal_iterator<const_jaegertracing::Tag_*,_std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>_>
  local_590;
  allocator local_581;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_580;
  allocator local_559;
  string local_558;
  Tag local_538;
  __normal_iterator<const_jaegertracing::Tag_*,_std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>_>
  local_4f0;
  __normal_iterator<const_jaegertracing::Tag_*,_std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>_>
  local_4e8;
  __normal_iterator<const_jaegertracing::Tag_*,_std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>_>
  local_4e0;
  bool local_4d1;
  undefined1 local_4d0 [8];
  AssertionResult gtest_ar_;
  shared_ptr<jaegertracing::Tracer> jaegerTracer;
  shared_ptr<opentracing::v3::Tracer> tracer;
  string local_498;
  duration local_478;
  allocator local_469;
  string local_468;
  RestrictionsConfig local_448;
  HeadersConfig local_418;
  allocator local_391;
  string local_390;
  allocator local_369;
  string local_368;
  int local_344;
  duration<long,_std::ratio<1L,_1000L>_> local_340;
  duration local_338;
  Config local_330;
  duration local_2d8;
  allocator local_2c9;
  string local_2c8;
  allocator local_2a1;
  string local_2a0;
  Config local_280;
  undefined1 local_228 [8];
  Config config;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  allocator local_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  undefined1 local_28 [8];
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> tags;
  Tracer_testTracerTags_Test *this_local;
  
  tags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::vector
            ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"foobar",&local_49);
  std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>::
  emplace_back<char_const(&)[9],std::__cxx11::string>
            ((vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>> *)local_28,
             (char (*) [9])"hostname",&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_80,"1.2.3",
             (allocator *)((long)&config._baggageRestrictions._refreshInterval.__r + 7));
  std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>::
  emplace_back<char_const(&)[15],std::__cxx11::string>
            ((vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>> *)local_28,
             (char (*) [15])"my.app.version",&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&config._baggageRestrictions._refreshInterval.__r + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2a0,"const",&local_2a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2c8,"",&local_2c9);
  local_2d8.__r = 0;
  samplers::Config::Config(&local_280,&local_2a0,1.0,&local_2c8,0,&local_2d8);
  local_344 = 100;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_340,&local_344);
  std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1000l>,void>
            ((duration<long,std::ratio<1l,1000000000l>> *)&local_338,&local_340);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_368,"",&local_369);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_390,"",&local_391);
  reporters::Config::Config(&local_330,0,&local_338,false,&local_368,&local_390);
  propagation::HeadersConfig::HeadersConfig(&local_418);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_468,"",&local_469);
  local_478.__r = 0;
  baggage::RestrictionsConfig::RestrictionsConfig(&local_448,false,&local_468,&local_478);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_498,"test-service",
             (allocator *)
             ((long)&tracer.super___shared_ptr<opentracing::v3::Tracer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  Config::Config((Config *)local_228,false,&local_280,&local_330,&local_418,&local_448,&local_498,
                 (vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)local_28);
  std::__cxx11::string::~string((string *)&local_498);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&tracer.super___shared_ptr<opentracing::v3::Tracer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  baggage::RestrictionsConfig::~RestrictionsConfig(&local_448);
  std::__cxx11::string::~string((string *)&local_468);
  std::allocator<char>::~allocator((allocator<char> *)&local_469);
  propagation::HeadersConfig::~HeadersConfig(&local_418);
  reporters::Config::~Config(&local_330);
  std::__cxx11::string::~string((string *)&local_390);
  std::allocator<char>::~allocator((allocator<char> *)&local_391);
  std::__cxx11::string::~string((string *)&local_368);
  std::allocator<char>::~allocator((allocator<char> *)&local_369);
  samplers::Config::~Config(&local_280);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  Tracer::make((Tracer *)
               &jaegerTracer.super___shared_ptr<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(Config *)local_228);
  std::static_pointer_cast<jaegertracing::Tracer,opentracing::v3::Tracer>
            ((shared_ptr<opentracing::v3::Tracer> *)&gtest_ar_.message_);
  peVar2 = std::__shared_ptr_access<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar_.message_);
  pvVar3 = Tracer::tags(peVar2);
  local_4e8._M_current =
       (Tag *)std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::begin(pvVar3);
  peVar2 = std::__shared_ptr_access<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar_.message_);
  pvVar3 = Tracer::tags(peVar2);
  local_4f0._M_current =
       (Tag *)std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::end(pvVar3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_558,"hostname",&local_559);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_580,"foobar",&local_581);
  Tag::Tag<std::__cxx11::string>(&local_538,&local_558,&local_580);
  local_4e0 = std::
              find<__gnu_cxx::__normal_iterator<jaegertracing::Tag_const*,std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>>,jaegertracing::Tag>
                        (local_4e8,local_4f0,&local_538);
  peVar2 = std::__shared_ptr_access<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar_.message_);
  pvVar3 = Tracer::tags(peVar2);
  local_590._M_current =
       (Tag *)std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::end(pvVar3);
  local_4d1 = __gnu_cxx::operator!=(&local_4e0,&local_590);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4d0,&local_4d1,(type *)0x0);
  Tag::~Tag(&local_538);
  std::__cxx11::string::~string((string *)&local_580);
  std::allocator<char>::~allocator((allocator<char> *)&local_581);
  std::__cxx11::string::~string((string *)&local_558);
  std::allocator<char>::~allocator((allocator<char> *)&local_559);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4d0);
  if (!bVar1) {
    testing::Message::Message(local_598);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_5c0,local_4d0,
               "std::find(jaegerTracer->tags().begin(), jaegerTracer->tags().end(), Tag(\"hostname\", std::string(\"foobar\"))) != jaegerTracer->tags().end()"
               ,"false");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_5a0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
               ,0x1e8,pcVar4);
    testing::internal::AssertHelper::operator=(local_5a0,local_598);
    testing::internal::AssertHelper::~AssertHelper(local_5a0);
    std::__cxx11::string::~string((string *)local_5c0);
    testing::Message::~Message(local_598);
  }
  gtest_ar__1.message_.ptr_._5_3_ = 0;
  gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4d0);
  if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
    peVar2 = std::
             __shared_ptr_access<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar_.message_);
    pvVar3 = Tracer::tags(peVar2);
    local_5f0._M_current =
         (Tag *)std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::begin(pvVar3);
    peVar2 = std::
             __shared_ptr_access<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar_.message_);
    pvVar3 = Tracer::tags(peVar2);
    local_5f8._M_current =
         (Tag *)std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::end(pvVar3);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_660,"my.app.version",&local_661);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_688,"1.2.3",&local_689);
    Tag::Tag<std::__cxx11::string>(&local_640,&local_660,&local_688);
    local_5e8 = std::
                find<__gnu_cxx::__normal_iterator<jaegertracing::Tag_const*,std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>>,jaegertracing::Tag>
                          (local_5f0,local_5f8,&local_640);
    peVar2 = std::
             __shared_ptr_access<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar_.message_);
    pvVar3 = Tracer::tags(peVar2);
    local_698._M_current =
         (Tag *)std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::end(pvVar3);
    local_5d9 = __gnu_cxx::operator!=(&local_5e8,&local_698);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_5d8,&local_5d9,(type *)0x0);
    Tag::~Tag(&local_640);
    std::__cxx11::string::~string((string *)&local_688);
    std::allocator<char>::~allocator((allocator<char> *)&local_689);
    std::__cxx11::string::~string((string *)&local_660);
    std::allocator<char>::~allocator((allocator<char> *)&local_661);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5d8);
    if (!bVar1) {
      testing::Message::Message(local_6a0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)&gtest_ar.message_,local_5d8,
                 "std::find(jaegerTracer->tags().begin(), jaegerTracer->tags().end(), Tag(\"my.app.version\", std::string(\"1.2.3\"))) != jaegerTracer->tags().end()"
                 ,"false");
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (local_6a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                 ,0x1ed,pcVar4);
      testing::internal::AssertHelper::operator=(local_6a8,local_6a0);
      testing::internal::AssertHelper::~AssertHelper(local_6a8);
      std::__cxx11::string::~string((string *)&gtest_ar.message_);
      testing::Message::~Message(local_6a0);
    }
    gtest_ar__1.message_.ptr_._5_3_ = 0;
    gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_5d8);
    if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_6f8,"test-service",&local_6f9);
      peVar2 = std::
               __shared_ptr_access<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&gtest_ar_.message_);
      rhs = Tracer::serviceName_abi_cxx11_(peVar2);
      testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
                ((EqHelper<false> *)local_6d8,"std::string(\"test-service\")",
                 "jaegerTracer->serviceName()",&local_6f8,rhs);
      std::__cxx11::string::~string((string *)&local_6f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_6f9);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6d8);
      if (!bVar1) {
        testing::Message::Message(local_708);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_6d8);
        testing::internal::AssertHelper::AssertHelper
                  (local_710,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                   ,0x1ef,pcVar4);
        testing::internal::AssertHelper::operator=(local_710,local_708);
        testing::internal::AssertHelper::~AssertHelper(local_710);
        testing::Message::~Message(local_708);
      }
      gtest_ar__1.message_.ptr_._5_3_ = 0;
      gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_6d8);
      if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
        gtest_ar__1.message_.ptr_._4_4_ = 0;
      }
    }
  }
  std::shared_ptr<jaegertracing::Tracer>::~shared_ptr
            ((shared_ptr<jaegertracing::Tracer> *)&gtest_ar_.message_);
  std::shared_ptr<opentracing::v3::Tracer>::~shared_ptr
            ((shared_ptr<opentracing::v3::Tracer> *)
             &jaegerTracer.super___shared_ptr<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  Config::~Config((Config *)local_228);
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector
            ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)local_28);
  return;
}

Assistant:

TEST(Tracer, testTracerTags)
{
    std::vector<Tag> tags;
    tags.emplace_back("hostname", std::string("foobar"));
    tags.emplace_back("my.app.version", std::string("1.2.3"));

    Config config(
        false,
        samplers::Config(
            "const", 1, "", 0, samplers::Config::Clock::duration()),
        reporters::Config(0, std::chrono::milliseconds(100), false, "", ""),
        propagation::HeadersConfig(),
        baggage::RestrictionsConfig(),
        "test-service",
        tags);

    auto tracer = Tracer::make(config);
    const auto jaegerTracer = std::static_pointer_cast<Tracer>(tracer);

    ASSERT_TRUE(std::find(jaegerTracer->tags().begin(),
                          jaegerTracer->tags().end(),
                          Tag("hostname", std::string("foobar"))) !=
        jaegerTracer->tags().end());

    ASSERT_TRUE(std::find(jaegerTracer->tags().begin(),
                          jaegerTracer->tags().end(),
                          Tag("my.app.version", std::string("1.2.3"))) !=
        jaegerTracer->tags().end());

    ASSERT_EQ(std::string("test-service"), jaegerTracer->serviceName());
}